

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.c
# Opt level: O0

void enable_dma(char *pci_addr)

{
  int iVar1;
  int *piVar2;
  __off_t _Var3;
  ssize_t sVar4;
  undefined8 in_RDI;
  char buf_1 [512];
  int err_1;
  int64_t result_1;
  uint16_t dma;
  char buf [512];
  int err;
  int64_t result;
  int fd;
  char path [4096];
  undefined1 local_1448 [516];
  int local_1244;
  long local_1240;
  ushort local_1232;
  long local_1230;
  undefined1 local_1228 [524];
  int local_101c;
  long local_1018;
  int local_100c;
  char local_1008 [4104];
  
  snprintf(local_1008,0x1000,"/sys/bus/pci/devices/%s/config",in_RDI);
  local_100c = open(local_1008,2);
  local_1230 = (long)local_100c;
  local_1018 = local_1230;
  if (local_1230 == -1) {
    piVar2 = __errno_location();
    local_101c = *piVar2;
    __xpg_strerror_r(local_101c,local_1228,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x1d,
            "enable_dma","open pci config",local_1228);
    exit(local_101c);
  }
  _Var3 = lseek(local_100c,4,0);
  if (_Var3 != 4) {
    __assert_fail("lseek(fd, 4, SEEK_SET) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x20,
                  "void enable_dma(const char *)");
  }
  local_1232 = 0;
  sVar4 = read(local_100c,&local_1232,2);
  if (sVar4 != 2) {
    __assert_fail("read(fd, &dma, 2) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x22,
                  "void enable_dma(const char *)");
  }
  local_1232 = local_1232 | 4;
  _Var3 = lseek(local_100c,4,0);
  if (_Var3 == 4) {
    sVar4 = write(local_100c,&local_1232,2);
    if (sVar4 != 2) {
      __assert_fail("write(fd, &dma, 2) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",
                    0x25,"void enable_dma(const char *)");
    }
    iVar1 = close(local_100c);
    local_1240 = (long)iVar1;
    if (local_1240 == -1) {
      piVar2 = __errno_location();
      local_1244 = *piVar2;
      __xpg_strerror_r(local_1244,local_1448,0x200);
      fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x26,
              "enable_dma","close",local_1448);
      exit(local_1244);
    }
    return;
  }
  __assert_fail("lseek(fd, 4, SEEK_SET) == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x24,
                "void enable_dma(const char *)");
}

Assistant:

void enable_dma(const char* pci_addr) {
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/config", pci_addr);
	int fd = check_err(open(path, O_RDWR), "open pci config");
	// write to the command register (offset 4) in the PCIe config space
	// bit 2 is "bus master enable", see PCIe 3.0 specification section 7.5.1.1
	assert(lseek(fd, 4, SEEK_SET) == 4);
	uint16_t dma = 0;
	assert(read(fd, &dma, 2) == 2);
	dma |= 1 << 2;
	assert(lseek(fd, 4, SEEK_SET) == 4);
	assert(write(fd, &dma, 2) == 2);
	check_err(close(fd), "close");
}